

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O2

value_type_conflict1
(anonymous_namespace)::serialize_and_visit<(anonymous_namespace)::StoreT<int>,int>(int *in)

{
  int iVar1;
  Result *result;
  string_view full_tag;
  string_view tag_00;
  ExpressionDecomposer local_1e8;
  cx_string<1UL> tag;
  StoreT<int> visitor;
  InputStream istream;
  OutputStream ostream;
  Result local_1c8;
  bool *local_1a8;
  Enum local_1a0;
  stringstream stream;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::ios::exceptions((int)*(undefined8 *)(_stream + -0x18) + (int)(stringstream *)&stream);
  ostream.stream = &stream;
  mserialize::serialize<int,OutputStream>(in,&ostream);
  visitor._value = 0;
  visitor._has_visit = false;
  result = (Result *)&istream;
  tag._data[0] = 'i';
  tag._data[1] = '\0';
  full_tag._len = 1;
  full_tag._ptr = tag._data;
  tag_00._len = 1;
  tag_00._ptr = tag._data;
  istream.stream = &stream;
  mserialize::detail::visit_impl<(anonymous_namespace)::StoreT<int>,InputStream>
            (full_tag,tag_00,&visitor,(InputStream *)result,0x800);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1e8,DT_CHECK);
  local_1a8 = &visitor._has_visit;
  local_1a0 = local_1e8.m_at;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_1c8,(Expression_lhs *)&local_1a8);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x18d2c8,(char *)0x2f,0x18eb88,&local_1c8.m_passed,result);
  doctest::String::~String(&local_1c8.m_decomp);
  iVar1 = visitor._value;
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return iVar1;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}